

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_shader.h
# Opt level: O0

GLuint s_loadProgram(char *vp,char *fp,char **attributes,int attributeCount)

{
  GLchar *__ptr;
  char *infoLog;
  int local_40;
  GLint infoLen;
  GLint linked;
  int i;
  GLuint program;
  GLuint fragmentShader;
  GLuint vertexShader;
  int attributeCount_local;
  char **attributes_local;
  char *fp_local;
  char *vp_local;
  
  fragmentShader = attributeCount;
  _vertexShader = attributes;
  attributes_local = (char **)fp;
  fp_local = vp;
  program = s_loadShader(0x8b31,vp);
  if (program == 0) {
    vp_local._4_4_ = 0;
  }
  else {
    i = s_loadShader(0x8b30,(char *)attributes_local);
    if (i == 0) {
      (*glad_glDeleteShader)(program);
      vp_local._4_4_ = 0;
    }
    else {
      linked = (*glad_glCreateProgram)();
      if (linked == 0) {
        fprintf(_stderr,"Could not create program!\n");
        vp_local._4_4_ = 0;
      }
      else {
        (*glad_glAttachShader)(linked,program);
        (*glad_glAttachShader)(linked,i);
        for (infoLen = 0; infoLen < (int)fragmentShader; infoLen = infoLen + 1) {
          (*glad_glBindAttribLocation)(linked,infoLen,_vertexShader[infoLen]);
        }
        (*glad_glLinkProgram)(linked);
        (*glad_glDeleteShader)(program);
        (*glad_glDeleteShader)(i);
        (*glad_glGetProgramiv)(linked,0x8b82,&local_40);
        if (local_40 == 0) {
          fprintf(_stderr,"Could not link program!\n");
          infoLog._4_4_ = 0;
          (*glad_glGetProgramiv)(linked,0x8b84,(GLint *)((long)&infoLog + 4));
          if (infoLog._4_4_ != 0) {
            __ptr = (GLchar *)malloc((long)infoLog._4_4_);
            (*glad_glGetProgramInfoLog)(linked,infoLog._4_4_,(GLsizei *)0x0,__ptr);
            fprintf(_stderr,"%s\n",__ptr);
            free(__ptr);
          }
          (*glad_glDeleteProgram)(linked);
          vp_local._4_4_ = 0;
        }
        else {
          vp_local._4_4_ = linked;
        }
      }
    }
  }
  return vp_local._4_4_;
}

Assistant:

static GLuint s_loadProgram(const char *vp, const char *fp, const char **attributes, int attributeCount)
{
	GLuint vertexShader = s_loadShader(GL_VERTEX_SHADER, vp);
	if (!vertexShader)
		return 0;
	GLuint fragmentShader = s_loadShader(GL_FRAGMENT_SHADER, fp);
	if (!fragmentShader)
	{
		glDeleteShader(vertexShader);
		return 0;
	}

	GLuint program = glCreateProgram();
	if (program == 0)
	{
		fprintf(stderr, "Could not create program!\n");
		return 0;
	}
	glAttachShader(program, vertexShader);
	glAttachShader(program, fragmentShader);
    
    for (int i = 0; i < attributeCount; i++)
        glBindAttribLocation(program, i, attributes[i]);
    
	glLinkProgram(program);
	glDeleteShader(vertexShader);
	glDeleteShader(fragmentShader);
	GLint linked;
	glGetProgramiv(program, GL_LINK_STATUS, &linked);
	if (!linked)
	{
		fprintf(stderr, "Could not link program!\n");
		GLint infoLen = 0;
		glGetProgramiv(program, GL_INFO_LOG_LENGTH, &infoLen);
		if (infoLen)
		{
			char* infoLog = (char*)malloc(sizeof(char) * infoLen);
			glGetProgramInfoLog(program, infoLen, NULL, infoLog);
			fprintf(stderr, "%s\n", infoLog);
			free(infoLog);
		}
		glDeleteProgram(program);
		return 0;
	}
	return program;
}